

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# correlation_suite.cpp
# Opt level: O0

void anscombe_quartet::anscombe_II(void)

{
  close_to<double> predicate;
  double absolute_tolerance;
  double *in_stack_ffffffffffffff68;
  double local_80;
  value_type local_78;
  undefined1 local_70 [8];
  correlation<double> filter;
  close_to<double> tolerance;
  
  absolute_tolerance = std::numeric_limits<double>::min();
  trial::online::detail::close_to<double>::close_to
            ((close_to<double> *)&filter.y_moment.sum,0.05,absolute_tolerance);
  trial::online::cumulative::correlation<double>::correlation((correlation<double> *)local_70);
  trial::online::cumulative::correlation<double>::push((correlation<double> *)local_70,10.0,9.14);
  trial::online::cumulative::correlation<double>::push((correlation<double> *)local_70,8.0,8.14);
  trial::online::cumulative::correlation<double>::push((correlation<double> *)local_70,13.0,8.74);
  trial::online::cumulative::correlation<double>::push((correlation<double> *)local_70,9.0,8.77);
  trial::online::cumulative::correlation<double>::push((correlation<double> *)local_70,11.0,9.26);
  trial::online::cumulative::correlation<double>::push((correlation<double> *)local_70,14.0,8.1);
  trial::online::cumulative::correlation<double>::push((correlation<double> *)local_70,6.0,6.13);
  trial::online::cumulative::correlation<double>::push((correlation<double> *)local_70,4.0,3.1);
  trial::online::cumulative::correlation<double>::push((correlation<double> *)local_70,12.0,9.13);
  trial::online::cumulative::correlation<double>::push((correlation<double> *)local_70,7.0,7.26);
  trial::online::cumulative::correlation<double>::push((correlation<double> *)local_70,5.0,4.74);
  local_78 = trial::online::cumulative::correlation<double>::value((correlation<double> *)local_70);
  local_80 = 0.816;
  predicate.absolute = tolerance.relative;
  predicate.relative = filter.y_moment.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","0.816","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/correlation_suite.cpp"
             ,(char *)0x66,0x104434,(char *)&local_78,&local_80,in_stack_ffffffffffffff68,predicate)
  ;
  return;
}

Assistant:

void anscombe_II()
{
    const auto tolerance = detail::close_to<double>(5e-2);
    cumulative::correlation<double> filter;

    filter.push(10.0, 9.14);
    filter.push(8.0, 8.14);
    filter.push(13.0, 8.74);
    filter.push(9.0, 8.77);
    filter.push(11.0, 9.26);
    filter.push(14.0, 8.10);
    filter.push(6.0, 6.13);
    filter.push(4.0, 3.10);
    filter.push(12.0, 9.13);
    filter.push(7.0, 7.26);
    filter.push(5.0, 4.74);
    TRIAL_TEST_WITH(filter.value(), 0.816, tolerance);
}